

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

int Cba_NtkCoFinNum(Cba_Ntk_t *p)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar3 = (p->vOutputs).nSize;
  lVar4 = (long)(p->vSeq).nSize;
  if (0 < lVar4) {
    lVar5 = 0;
    do {
      uVar1 = (p->vSeq).pArray[lVar5];
      if ((int)uVar1 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                      ,0xeb,"int Cba_ObjFinNum(Cba_Ntk_t *, int)");
      }
      if ((p->vObjFin0).nSize <= (int)(uVar1 + 1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = (p->vObjFin0).pArray;
      iVar3 = (iVar3 + piVar2[(ulong)uVar1 + 1]) - piVar2[uVar1];
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  return iVar3;
}

Assistant:

int Cba_NtkCoFinNum( Cba_Ntk_t * p )
{
    int i, iObj, Count = Cba_NtkPoNum(p);
    Cba_NtkForEachBoxSeq( p, iObj, i )
        Count += Cba_ObjFinNum(p, iObj);
    return Count;  
}